

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void lws_tls_restrict_return(lws_context *context)

{
  int iVar1;
  lws_context *context_local;
  
  if (context->simultaneous_ssl_restriction != 0) {
    iVar1 = context->simultaneous_ssl;
    context->simultaneous_ssl = iVar1 + -1;
    if (iVar1 == context->simultaneous_ssl_restriction) {
      lws_gate_accepts(context,1);
    }
    _lws_log(8,"%s: %d -> %d\n","lws_tls_restrict_return",(ulong)(context->simultaneous_ssl + 1),
             (ulong)(uint)context->simultaneous_ssl);
  }
  return;
}

Assistant:

void
lws_tls_restrict_return(struct lws_context *context)
{
	if (context->simultaneous_ssl_restriction) {
		if (context->simultaneous_ssl-- ==
					context->simultaneous_ssl_restriction)
			/* we made space and can do an accept */
			lws_gate_accepts(context, 1);
		lwsl_info("%s: %d -> %d\n", __func__,
			  context->simultaneous_ssl + 1,
			  context->simultaneous_ssl);
	}
}